

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_fader_set_fade_ex
               (ma_fader *pFader,float volumeBeg,float volumeEnd,ma_uint64 lengthInFrames,
               ma_int64 startOffsetInFrames)

{
  long in_RDX;
  ulong in_RSI;
  ma_fader *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  long local_20;
  ulong local_18;
  float local_c;
  
  if (in_RDI != (ma_fader *)0x0) {
    local_c = in_XMM0_Da;
    if (in_XMM0_Da < 0.0) {
      local_c = ma_fader_get_current_volume(in_RDI);
    }
    local_18 = in_RSI;
    if (0xffffffff < in_RSI) {
      local_18 = 0xffffffff;
    }
    local_20 = in_RDX;
    if (0x7fffffff < in_RDX) {
      local_20 = 0x7fffffff;
    }
    in_RDI->volumeBeg = local_c;
    in_RDI->volumeEnd = in_XMM1_Da;
    in_RDI->lengthInFrames = local_18;
    in_RDI->cursorInFrames = -local_20;
  }
  return;
}

Assistant:

MA_API void ma_fader_set_fade_ex(ma_fader* pFader, float volumeBeg, float volumeEnd, ma_uint64 lengthInFrames, ma_int64 startOffsetInFrames)
{
    if (pFader == NULL) {
        return;
    }

    /* If the volume is negative, use current volume. */
    if (volumeBeg < 0) {
        volumeBeg = ma_fader_get_current_volume(pFader);
    }

    /*
    The length needs to be clamped to 32-bits due to how we convert it to a float for linear
    interpolation reasons. I might change this requirement later, but for now it's not important.
    */
    if (lengthInFrames > UINT_MAX) {
        lengthInFrames = UINT_MAX;
    }

    /* The start offset needs to be clamped to ensure it doesn't overflow a signed number. */
    if (startOffsetInFrames > INT_MAX) {
        startOffsetInFrames = INT_MAX;
    }

    pFader->volumeBeg      = volumeBeg;
    pFader->volumeEnd      = volumeEnd;
    pFader->lengthInFrames = lengthInFrames;
    pFader->cursorInFrames = -startOffsetInFrames;
}